

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::detail::ResultBuilder::translateException(ResultBuilder *this)

{
  String SStack_28;
  
  (this->super_AssertData).m_threw = true;
  anon_unknown_15::translateActiveException();
  String::operator=(&(this->super_AssertData).m_exception,&SStack_28);
  String::~String(&SStack_28);
  return;
}

Assistant:

void ResultBuilder::translateException() {
        m_threw     = true;
        m_exception = translateActiveException();
    }